

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O3

char * choc::text::FloatToStringBuffer<double>::writeShortInteger(char *dest,int n)

{
  bool bVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  
  if (n < 0) {
    uVar6 = (ulong)(uint)n;
    do {
      *dest = 0x2d;
      dest = (char *)((byte *)dest + 1);
      iVar4 = (int)uVar6;
      uVar6 = (ulong)(uint)-iVar4;
      bVar1 = 0 < n;
      n = -iVar4;
    } while (bVar1);
  }
  else {
    uVar6 = (ulong)(uint)n;
  }
  uVar5 = (uint)uVar6;
  if (uVar5 < 100) {
    lVar7 = 1;
    pbVar9 = (byte *)dest;
    if (9 < uVar5) {
      bVar3 = (byte)((uVar5 & 0xff) / 10);
      uVar6 = (ulong)(byte)((char)uVar6 + bVar3 * -10);
      *dest = bVar3 | 0x30;
      lVar7 = 2;
      pbVar9 = (byte *)dest + 1;
    }
  }
  else {
    uVar8 = uVar6 / 100;
    uVar10 = uVar6 / 10;
    uVar2 = uVar6 / 10;
    uVar6 = (ulong)(uVar5 + ((int)uVar2 + (int)(uVar6 / 10)) * -5);
    *dest = (char)uVar8 + 0x30;
    ((byte *)dest)[1] = (char)uVar2 + (char)(uVar10 * 0x1999999a >> 0x20) * -10 | 0x30;
    lVar7 = 3;
    pbVar9 = (byte *)dest + 2;
  }
  *pbVar9 = (byte)uVar6 | 0x30;
  return (char *)((byte *)dest + lVar7);
}

Assistant:

[[nodiscard]] static char* writeShortInteger (char* dest, int n)
    {
        if (n < 0)    return writeShortInteger (write (dest, '-'), -n);
        if (n >= 100) return writeDigit (dest, n / 100, (n / 10) % 10, n % 10);
        if (n >= 10)  return writeDigit (dest, n / 10,  n % 10);

        return writeDigit (dest, n);
    }